

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODUPCEANCommon.h
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
ZXing::OneD::UPCEANCommon::ConvertUPCEtoUPCA<std::__cxx11::wstring>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *upce)

{
  ulong uVar1;
  wchar_t *pwVar2;
  wstring *in_RSI;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RDI;
  value_type lastChar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> upceChars;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result;
  allocator<wchar_t> *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  wchar_t wVar3;
  size_type in_stack_fffffffffffffe28;
  allocator<wchar_t> *__n;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffe30;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *this;
  allocator<wchar_t> local_1a1;
  wstring local_1a0 [32];
  wstring local_180 [39];
  allocator<wchar_t> local_159;
  wstring local_158 [32];
  wstring local_138 [32];
  wstring local_118 [39];
  allocator<wchar_t> local_f1;
  wstring local_f0 [32];
  wstring local_d0 [32];
  wstring local_b0 [39];
  undefined1 local_89 [33];
  wstring local_68 [32];
  wchar_t local_48;
  undefined1 local_31;
  wstring local_30 [32];
  wstring *local_10;
  
  wVar3 = (wchar_t)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  local_10 = in_RSI;
  uVar1 = std::__cxx11::wstring::length();
  if (uVar1 < 7) {
    std::__cxx11::wstring::wstring((wstring *)in_RDI,local_10);
  }
  else {
    std::__cxx11::wstring::substr((ulong)local_30,(ulong)local_10);
    local_31 = 0;
    std::__cxx11::wstring::wstring((wstring *)in_RDI);
    std::__cxx11::wstring::reserve((ulong)in_RDI);
    pwVar2 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)local_10);
    std::__cxx11::wstring::operator+=((wstring *)in_RDI,*pwVar2);
    pwVar2 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)local_30);
    local_48 = *pwVar2;
    if ((uint)(local_48 + L'\xffffffd0') < 3) {
      std::__cxx11::wstring::substr((ulong)local_68,(ulong)local_30);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_68);
      std::__cxx11::wstring::~wstring(local_68);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_48);
      this = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_89;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                (this,in_stack_fffffffffffffe28,wVar3,in_stack_fffffffffffffe18);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,(wstring *)(local_89 + 1));
      std::__cxx11::wstring::~wstring((wstring *)(local_89 + 1));
      std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)local_89);
      std::__cxx11::wstring::substr((ulong)local_b0,(ulong)local_30);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_b0);
      std::__cxx11::wstring::~wstring(local_b0);
    }
    else if (local_48 == L'3') {
      std::__cxx11::wstring::substr((ulong)local_d0,(ulong)local_30);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_d0);
      std::__cxx11::wstring::~wstring(local_d0);
      __n = &local_f1;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                (in_stack_fffffffffffffe30,(size_type)__n,wVar3,in_stack_fffffffffffffe18);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_f0);
      std::__cxx11::wstring::~wstring(local_f0);
      std::allocator<wchar_t>::~allocator(&local_f1);
      std::__cxx11::wstring::substr((ulong)local_118,(ulong)local_30);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_118);
      std::__cxx11::wstring::~wstring(local_118);
    }
    else if (local_48 == L'4') {
      std::__cxx11::wstring::substr((ulong)local_138,(ulong)local_30);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_138);
      std::__cxx11::wstring::~wstring(local_138);
      wVar3 = (wchar_t)((ulong)&local_159 >> 0x20);
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,wVar3,in_stack_fffffffffffffe18
                );
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_158);
      std::__cxx11::wstring::~wstring(local_158);
      std::allocator<wchar_t>::~allocator(&local_159);
      pwVar2 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)local_30);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,*pwVar2);
    }
    else {
      std::__cxx11::wstring::substr((ulong)local_180,(ulong)local_30);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_180);
      std::__cxx11::wstring::~wstring(local_180);
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,wVar3,in_stack_fffffffffffffe18
                );
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_1a0);
      std::__cxx11::wstring::~wstring(local_1a0);
      std::allocator<wchar_t>::~allocator(&local_1a1);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,local_48);
    }
    uVar1 = std::__cxx11::wstring::length();
    if (7 < uVar1) {
      pwVar2 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)local_10);
      std::__cxx11::wstring::operator+=((wstring *)in_RDI,*pwVar2);
    }
    local_31 = 1;
    std::__cxx11::wstring::~wstring(local_30);
  }
  return in_RDI;
}

Assistant:

StringT ConvertUPCEtoUPCA(const StringT& upce)
{
	if (upce.length() < 7)
		return upce;

	auto upceChars = upce.substr(1, 6);

	StringT result;
	result.reserve(12);
	result += upce[0];
	auto lastChar = upceChars[5];
	switch (lastChar) {
	case '0':
	case '1':
	case '2':
		result += upceChars.substr(0, 2);
		result += lastChar;
		result += StringT(4, '0');
		result += upceChars.substr(2, 3);
		break;
	case '3':
		result += upceChars.substr(0, 3);
		result += StringT(5, '0');
		result += upceChars.substr(3, 2);
		break;
	case '4':
		result += upceChars.substr(0, 4);
		result += StringT(5, '0');
		;
		result += upceChars[4];
		break;
	default:
		result += upceChars.substr(0, 5);
		result += StringT(4, '0');
		result += lastChar;
		break;
	}
	// Only append check digit in conversion if supplied
	if (upce.length() >= 8) {
		result += upce[7];
	}
	return result;
}